

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR xpath_substring_after
                 (lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  int iVar1;
  lyxp_set *plVar2;
  ushort *puVar3;
  ly_bool lVar4;
  LY_ERR ret__;
  LY_ERR LVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  uint32_t uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  undefined4 uVar13;
  ly_ctx *plVar14;
  
  plVar2 = *args;
  if ((options & 0x1c) == 0) {
    LVar5 = lyxp_set_cast(plVar2,LYXP_SET_STRING);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    LVar5 = lyxp_set_cast(args[1],LYXP_SET_STRING);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    pcVar8 = (args[1]->val).str;
    pcVar11 = strstr(((*args)->val).str,pcVar8);
    if (pcVar11 == (char *)0x0) {
      set_fill_string(set,"",0);
      return LY_SUCCESS;
    }
    sVar6 = strlen(pcVar8);
    sVar7 = strlen(pcVar11 + sVar6);
    set_fill_string(set,pcVar11 + sVar6,(uint32_t)sVar7);
  }
  else {
    if (plVar2->type == LYXP_SET_SCNODE_SET) {
      uVar9 = plVar2->used;
      do {
        uVar9 = uVar9 - 1;
        if (*(int *)((long)(plVar2->val).nodes + (ulong)uVar9 * 0x18 + 0xc) == 2) {
          puVar3 = *(ushort **)((long)(plVar2->val).nodes + (ulong)uVar9 * 0x18);
          if (puVar3 == (ushort *)0x0) break;
          if ((*puVar3 & 0xc) == 0) {
            plVar14 = set->ctx;
            pcVar8 = lys_nodetype2str(*puVar3);
            pcVar11 = "Argument #1 of %s is a %s node \"%s\".";
          }
          else {
            lVar4 = warn_is_string_type(*(lysc_type **)(puVar3 + 0x30));
            if (lVar4 != '\0') break;
            plVar14 = set->ctx;
            pcVar8 = *(char **)(puVar3 + 0x14);
            pcVar11 = "Argument #1 of %s is node \"%s\", not of string-type.";
          }
          ly_log(plVar14,LY_LLWRN,LY_SUCCESS,pcVar11,"xpath_substring_after",pcVar8);
          break;
        }
      } while (uVar9 != 0);
    }
    plVar2 = args[1];
    if (plVar2->type == LYXP_SET_SCNODE_SET) {
      uVar10 = plVar2->used;
      do {
        uVar10 = uVar10 - 1;
        if (*(int *)((long)(plVar2->val).nodes + (ulong)uVar10 * 0x18 + 0xc) == 2) {
          puVar3 = *(ushort **)((long)(plVar2->val).nodes + (ulong)uVar10 * 0x18);
          if (puVar3 == (ushort *)0x0) break;
          if ((*puVar3 & 0xc) == 0) {
            plVar14 = set->ctx;
            pcVar8 = lys_nodetype2str(*puVar3);
            pcVar11 = "Argument #2 of %s is a %s node \"%s\".";
          }
          else {
            lVar4 = warn_is_string_type(*(lysc_type **)(puVar3 + 0x30));
            if (lVar4 != '\0') break;
            plVar14 = set->ctx;
            pcVar8 = *(char **)(puVar3 + 0x14);
            pcVar11 = "Argument #2 of %s is node \"%s\", not of string-type.";
          }
          ly_log(plVar14,LY_LLWRN,LY_SUCCESS,pcVar11,"xpath_substring_after",pcVar8);
          break;
        }
      } while (uVar10 != 0);
    }
    uVar10 = set->used;
    if ((ulong)uVar10 != 0) {
      lVar12 = 0;
      do {
        iVar1 = *(int *)((long)&((set->val).nodes)->pos + lVar12);
        if (iVar1 == 2) {
          uVar13 = 1;
LAB_001b3201:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar12) = uVar13;
        }
        else if (iVar1 == -2) {
          uVar13 = 0xffffffff;
          goto LAB_001b3201;
        }
        lVar12 = lVar12 + 0x18;
      } while ((ulong)uVar10 * 0x18 != lVar12);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_substring_after(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    char *ptr;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);
    rc = lyxp_set_cast(args[1], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    ptr = strstr(args[0]->val.str, args[1]->val.str);
    if (ptr) {
        set_fill_string(set, ptr + strlen(args[1]->val.str), strlen(ptr + strlen(args[1]->val.str)));
    } else {
        set_fill_string(set, "", 0);
    }

    return LY_SUCCESS;
}